

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

Stream * rw::ps2::writeNativeData(Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  long lVar2;
  uint32 uVar3;
  uint32 in_RAX [2];
  long lVar4;
  uint32 i;
  ulong uVar5;
  uint32 buf [2];
  
  buf = in_RAX;
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 4)) {
    Stream::writeU32(stream,4);
    lVar1 = *(long *)((long)object + 0x98);
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < *(uint *)(lVar1 + 4); uVar5 = uVar5 + 1) {
      lVar2 = *(long *)(lVar1 + 8);
      buf[0] = *(uint32 *)(lVar2 + lVar4);
      uVar3 = unfixDmaOffsets((InstanceData *)(lVar2 + lVar4));
      buf[1] = uVar3;
      Stream::write32(stream,buf,8);
      (*stream->_vptr_Stream[3])
                (stream,*(undefined8 *)(lVar2 + 0x10 + lVar4),(ulong)*(uint *)(lVar2 + lVar4));
      lVar4 = lVar4 + 0x20;
    }
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return stream;
	stream->writeU32(PLATFORM_PS2);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		uint32 buf[2];
		buf[0] = instance->dataSize;
		buf[1] = unfixDmaOffsets(instance);
		stream->write32(buf, 8);
		stream->write8(instance->data, instance->dataSize);
#ifdef RW_PS2
		if(!buf[1])
			fixDmaOffsets(instance);
#endif
	}
	return stream;
}